

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O0

CURLcode cf_hc_query(Curl_cfilter *cf,Curl_easy *data,int query,int *pres1,void *pres2)

{
  void *pvVar1;
  _Bool _Var2;
  curltime cVar3;
  CURLcode local_8c;
  undefined4 uStack_64;
  curltime *when_1;
  undefined4 uStack_4c;
  curltime *when;
  cf_hc_ctx *ctx;
  void *pres2_local;
  int *pres1_local;
  int query_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  if ((cf->field_0x24 & 1) == 0) {
    if (query == 4) {
      cVar3 = cf_get_max_baller_time(cf,data,4);
      *(time_t *)pres2 = cVar3.tv_sec;
      *(ulong *)((long)pres2 + 8) = CONCAT44(uStack_4c,cVar3.tv_usec);
      return CURLE_OK;
    }
    if (query == 5) {
      cVar3 = cf_get_max_baller_time(cf,data,5);
      *(time_t *)pres2 = cVar3.tv_sec;
      *(ulong *)((long)pres2 + 8) = CONCAT44(uStack_64,cVar3.tv_usec);
      return CURLE_OK;
    }
    if ((query == 7) &&
       ((_Var2 = cf_hc_baller_needs_flush((cf_hc_baller *)((long)pvVar1 + 0x28),data), _Var2 ||
        (_Var2 = cf_hc_baller_needs_flush((cf_hc_baller *)((long)pvVar1 + 0x58),data), _Var2)))) {
      *pres1 = 1;
      return CURLE_OK;
    }
  }
  if (cf->next == (Curl_cfilter *)0x0) {
    local_8c = CURLE_UNKNOWN_OPTION;
  }
  else {
    local_8c = (*cf->next->cft->query)(cf->next,data,query,pres1,pres2);
  }
  return local_8c;
}

Assistant:

static CURLcode cf_hc_query(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int query, int *pres1, void *pres2)
{
  struct cf_hc_ctx *ctx = cf->ctx;

  if(!cf->connected) {
    switch(query) {
    case CF_QUERY_TIMER_CONNECT: {
      struct curltime *when = pres2;
      *when = cf_get_max_baller_time(cf, data, CF_QUERY_TIMER_CONNECT);
      return CURLE_OK;
    }
    case CF_QUERY_TIMER_APPCONNECT: {
      struct curltime *when = pres2;
      *when = cf_get_max_baller_time(cf, data, CF_QUERY_TIMER_APPCONNECT);
      return CURLE_OK;
    }
    case CF_QUERY_NEED_FLUSH: {
      if(cf_hc_baller_needs_flush(&ctx->h3_baller, data)
         || cf_hc_baller_needs_flush(&ctx->h21_baller, data)) {
        *pres1 = TRUE;
        return CURLE_OK;
      }
      break;
    }
    default:
      break;
    }
  }
  return cf->next?
    cf->next->cft->query(cf->next, data, query, pres1, pres2) :
    CURLE_UNKNOWN_OPTION;
}